

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O1

void svc_xprt_dump_xprts(char *tag)

{
  rbtree_x_part *prVar1;
  rbtree_x_part *prVar2;
  int iVar3;
  opr_rbtree_node *node;
  ulong uVar4;
  
  if (initialized == '\x01') {
    uVar4 = 0;
    do {
      prVar2 = svc_xprt_fd.xt.tree;
      prVar1 = svc_xprt_fd.xt.tree + uVar4;
      iVar3 = pthread_rwlock_rdlock((pthread_rwlock_t *)&prVar1->lock);
      if (iVar3 != 0) {
LAB_00120968:
        abort();
      }
      if ((__ntirpc_pkg_params.debug_flags._2_1_ & 0x20) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("xprts at %s: tree %d size %d",tag,uVar4 & 0xffffffff,prVar2[uVar4].t.size);
      }
      for (node = opr_rbtree_first(&prVar2[uVar4].t); node != (opr_rbtree_node *)0x0;
          node = opr_rbtree_next(node)) {
        if ((__ntirpc_pkg_params.debug_flags._2_1_ & 0x20) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("xprts at %s: %p xp_fd %d",tag,&node[-0x1a].red,
                     (ulong)*(uint *)&node[-0xd].parent);
        }
      }
      iVar3 = pthread_rwlock_unlock((pthread_rwlock_t *)&prVar1->lock);
      if (iVar3 != 0) goto LAB_00120968;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0xc1);
  }
  return;
}

Assistant:

void
svc_xprt_dump_xprts(const char *tag)
{
	struct rbtree_x_part *t = NULL;
	struct opr_rbtree_node *n;
	struct rpc_dplx_rec *rec;
	int p_ix;

	if (!initialized)
		goto out;

	p_ix = 0;
	while (p_ix < SVC_XPRT_PARTITIONS) {
		t = &svc_xprt_fd.xt.tree[p_ix];
		rwlock_rdlock(&t->lock);	/* t RLOCKED */
		__warnx(TIRPC_DEBUG_FLAG_SVC_XPRT,
			"xprts at %s: tree %d size %d", tag, p_ix, t->t.size);
		n = opr_rbtree_first(&t->t);
		while (n != NULL) {
			rec = opr_containerof(n, struct rpc_dplx_rec, fd_node);
			__warnx(TIRPC_DEBUG_FLAG_SVC_XPRT,
				"xprts at %s: %p xp_fd %d",
				tag, &rec->xprt, rec->xprt.xp_fd);
			n = opr_rbtree_next(n);
		}		/* curr partition */
		rwlock_unlock(&t->lock);	/* t !LOCKED */
		p_ix++;
	}			/* SVC_XPRT_PARTITIONS */
 out:
	return;
}